

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  byte bVar2;
  long *plVar3;
  ulong uVar4;
  SDKResult result;
  uint8_t ping [5];
  string line;
  char cline [512];
  MyClient client;
  LogStringBuffer buffer_4;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer_2;
  LogStringBuffer buffer_3;
  LogStringBuffer buffer_5;
  LogStringBuffer buffer_6;
  undefined4 in_stack_ffffffffffffea08;
  uint32_t in_stack_ffffffffffffea0c;
  LogStringBuffer *in_stack_ffffffffffffea10;
  undefined8 in_stack_ffffffffffffea18;
  Channel *pCVar5;
  OutputWorker *in_stack_ffffffffffffea20;
  SDKSocket *in_stack_ffffffffffffea28;
  SDKResult *in_stack_ffffffffffffea38;
  LogStringBuffer *in_stack_ffffffffffffea48;
  Channel *in_stack_ffffffffffffea50;
  uint in_stack_ffffffffffffeaec;
  FunctionTimer *in_stack_ffffffffffffeaf0;
  string local_1478 [32];
  MyClient *in_stack_ffffffffffffeba8;
  string local_1450 [36];
  TonkResult local_142c;
  undefined4 local_1428;
  undefined1 local_1424;
  int local_1420;
  allocator local_1419;
  string local_1418 [32];
  char local_13f8 [804];
  undefined4 local_10d4;
  char *local_10d0;
  Channel *local_10c8;
  char *local_10c0;
  Channel *local_10b8;
  string *local_10b0;
  char *local_10a8;
  Channel *local_10a0;
  char *local_1098;
  Channel *local_1090;
  char *local_1088;
  Channel *local_1080;
  char *local_1078;
  Channel *local_1070;
  char *local_1068;
  Channel *local_1060;
  char *local_1058;
  undefined4 local_104c;
  Channel *local_1048;
  undefined4 local_103c;
  Channel *local_1038;
  undefined1 local_1020 [16];
  ostream aoStack_1010 [376];
  char *local_e98;
  undefined4 local_e8c;
  Channel *local_e88;
  char *local_e80;
  undefined8 local_e78;
  undefined1 *local_e70;
  Channel *local_e68;
  undefined8 local_e60;
  undefined1 *local_e58;
  Channel *local_e50;
  undefined8 local_e48;
  undefined1 *local_e40;
  char *local_e38;
  undefined1 *local_e30;
  Channel *local_e28;
  char *local_e20;
  undefined1 *local_e18;
  char *local_e10;
  undefined4 local_e04;
  Channel *local_e00;
  undefined4 local_df4;
  Channel *local_df0;
  undefined1 local_dd8 [16];
  ostream aoStack_dc8 [376];
  char *local_c50;
  undefined4 local_c44;
  Channel *local_c40;
  char *local_c38;
  undefined8 local_c30;
  undefined1 *local_c28;
  Channel *local_c20;
  undefined8 local_c18;
  undefined1 *local_c10;
  Channel *local_c08;
  undefined8 local_c00;
  undefined1 *local_bf8;
  char *local_bf0;
  undefined1 *local_be8;
  Channel *local_be0;
  char *local_bd8;
  undefined1 *local_bd0;
  char *local_bc8;
  undefined4 local_bbc;
  Channel *local_bb8;
  undefined4 local_bac;
  Channel *local_ba8;
  undefined1 local_b90 [16];
  ostream aoStack_b80 [376];
  char *local_a08;
  undefined4 local_9fc;
  Channel *local_9f8;
  char *local_9f0;
  undefined8 local_9e8;
  undefined1 *local_9e0;
  Channel *local_9d8;
  undefined8 local_9d0;
  undefined1 *local_9c8;
  Channel *local_9c0;
  undefined8 local_9b8;
  undefined1 *local_9b0;
  char *local_9a8;
  undefined1 *local_9a0;
  Channel *local_998;
  char *local_990;
  undefined1 *local_988;
  string *local_980;
  char *local_978;
  undefined4 local_96c;
  Channel *local_968;
  undefined4 local_95c;
  Channel *local_958;
  undefined1 local_940 [16];
  ostream aoStack_930 [376];
  string *local_7b8;
  char *local_7b0;
  undefined4 local_7a4;
  Channel *local_7a0;
  string *local_798;
  char *local_790;
  undefined8 local_788;
  undefined1 *local_780;
  Channel *local_778;
  undefined8 local_770;
  undefined1 *local_768;
  Channel *local_760;
  undefined8 local_758;
  undefined1 *local_750;
  string *local_748;
  char *local_740;
  undefined1 *local_738;
  Channel *local_730;
  string *local_728;
  undefined1 *local_720;
  Channel *local_718;
  string *local_710;
  undefined1 *local_708;
  char *local_700;
  undefined1 *local_6f8;
  Channel *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  char *local_6d8;
  undefined4 local_6cc;
  Channel *local_6c8;
  undefined4 local_6bc;
  Channel *local_6b8;
  undefined1 local_6a0 [16];
  ostream aoStack_690 [376];
  char *local_518;
  undefined4 local_50c;
  Channel *local_508;
  char *local_500;
  undefined8 local_4f8;
  undefined1 *local_4f0;
  Channel *local_4e8;
  undefined8 local_4e0;
  undefined1 *local_4d8;
  Channel *local_4d0;
  undefined8 local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  Channel *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  char *local_490;
  undefined4 local_484;
  Channel *local_480;
  undefined4 local_474;
  Channel *local_470;
  LogStringBuffer local_458;
  char *local_2d0;
  undefined4 local_2c4;
  Channel *local_2c0;
  char *local_2b8;
  undefined8 local_2b0;
  LogStringBuffer *local_2a8;
  Channel *local_2a0;
  undefined8 local_298;
  LogStringBuffer *local_290;
  Channel *local_288;
  undefined8 local_280;
  LogStringBuffer *local_278;
  char *local_270;
  LogStringBuffer *local_268;
  OutputWorker *local_260;
  char *local_258;
  LogStringBuffer *local_250;
  char *local_248;
  undefined4 local_23c;
  Channel *local_238;
  undefined4 local_22c;
  Channel *local_228;
  OutputWorker local_210;
  char *local_88;
  undefined4 local_7c;
  Channel *local_78;
  char *local_70;
  string *local_68;
  OutputWorker *local_60;
  Channel *local_58;
  string *local_50;
  OutputWorker *local_48;
  Channel *local_40;
  string *local_38;
  OutputWorker *local_30;
  char *local_28;
  OutputWorker *local_20;
  Channel *local_18;
  char *local_10;
  OutputWorker *local_8;
  
  local_10d4 = 0;
  MyClient::MyClient((MyClient *)in_stack_ffffffffffffea10);
  bVar1 = MyClient::Initialize(in_stack_ffffffffffffeba8);
  if (bVar1) {
    local_10c8 = &Logger;
    local_10d0 = 
    "Press SPACE key to stop server. Any other key will send an advertisement broadcast";
    local_e00 = &Logger;
    local_e04 = 1;
    local_e10 = "Press SPACE key to stop server. Any other key will send an advertisement broadcast"
    ;
    local_df0 = &Logger;
    local_df4 = 1;
    if ((int)Logger.ChannelMinLevel < 2) {
      local_c40 = &Logger;
      local_c44 = 1;
      local_c50 = 
      "Press SPACE key to stop server. Any other key will send an advertisement broadcast";
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffea10,
                 (char *)CONCAT44(in_stack_ffffffffffffea0c,in_stack_ffffffffffffea08),Trace);
      local_c30 = 0x12d358;
      local_c20 = &Logger;
      local_c28 = local_dd8;
      local_c38 = local_c50;
      local_c08 = &Logger;
      local_c18 = local_c30;
      local_c10 = local_c28;
      local_c00 = local_c30;
      local_bf8 = local_c28;
      std::operator<<(aoStack_dc8,(string *)&Logger.Prefix);
      local_be0 = &Logger;
      local_be8 = local_c28;
      local_bf0 = local_c38;
      local_bd0 = local_c28;
      local_bd8 = local_c38;
      std::operator<<((ostream *)(local_c28 + 0x10),local_c38);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)in_stack_ffffffffffffea50,in_stack_ffffffffffffea48);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10dc45);
    }
    do {
      plVar3 = (long *)std::istream::getline((char *)&std::cin,(long)local_13f8);
      bVar2 = std::ios::operator!((ios *)((long)plVar3 + *(long *)(*plVar3 + -0x18)));
      if ((bVar2 & 1) != 0) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1418,local_13f8,&local_1419);
      std::allocator<char>::~allocator((allocator<char> *)&local_1419);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        local_1424 = 4;
        local_1428 = 0x3020164;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1450,"",(allocator *)&stack0xffffffffffffebaf);
        local_142c = (TonkResult)
                     tonk::SDKSocket::Advertise
                               (in_stack_ffffffffffffea28,(string *)in_stack_ffffffffffffea20,
                                (uint16_t)((ulong)in_stack_ffffffffffffea18 >> 0x30),
                                in_stack_ffffffffffffea10,in_stack_ffffffffffffea0c);
        std::__cxx11::string::~string(local_1450);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffebaf);
        bVar1 = tonk::SDKResult::operator_cast_to_bool((SDKResult *)0x10de31);
        if (bVar1) {
          local_10b8 = &Logger;
          local_10c0 = "Sent advertisement";
          local_bb8 = &Logger;
          local_bbc = 2;
          local_bc8 = "Sent advertisement";
          local_ba8 = &Logger;
          local_bac = 2;
          if ((int)Logger.ChannelMinLevel < 3) {
            local_9f8 = &Logger;
            local_9fc = 2;
            local_a08 = "Sent advertisement";
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffea10,
                       (char *)CONCAT44(in_stack_ffffffffffffea0c,in_stack_ffffffffffffea08),Trace);
            local_9e8 = 0x12d358;
            local_9d8 = &Logger;
            local_9e0 = local_b90;
            local_9f0 = local_a08;
            local_9c0 = &Logger;
            local_9d0 = local_9e8;
            local_9c8 = local_9e0;
            local_9b8 = local_9e8;
            local_9b0 = local_9e0;
            std::operator<<(aoStack_b80,(string *)&Logger.Prefix);
            local_998 = &Logger;
            local_9a0 = local_9e0;
            local_9a8 = local_9f0;
            local_988 = local_9e0;
            local_990 = local_9f0;
            std::operator<<((ostream *)(local_9e0 + 0x10),local_9f0);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write
                      ((OutputWorker *)in_stack_ffffffffffffea50,in_stack_ffffffffffffea48);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10e0bf);
          }
        }
        else {
          tonk::SDKResult::ToString_abi_cxx11_(in_stack_ffffffffffffea38);
          local_10a0 = &Logger;
          local_10a8 = "Advertise failed: ";
          local_10b0 = local_1478;
          local_968 = &Logger;
          local_96c = 4;
          local_978 = "Advertise failed: ";
          local_958 = &Logger;
          local_95c = 4;
          local_980 = local_10b0;
          if ((int)Logger.ChannelMinLevel < 5) {
            local_7a0 = &Logger;
            local_7a4 = 4;
            local_7b0 = "Advertise failed: ";
            local_7b8 = local_10b0;
            logger::LogStringBuffer::LogStringBuffer
                      (in_stack_ffffffffffffea10,
                       (char *)CONCAT44(in_stack_ffffffffffffea0c,in_stack_ffffffffffffea08),Trace);
            local_788 = 0x12d358;
            local_778 = &Logger;
            local_780 = local_940;
            local_790 = local_7b0;
            local_798 = local_7b8;
            local_760 = &Logger;
            local_770 = local_788;
            local_768 = local_780;
            local_758 = local_788;
            local_750 = local_780;
            std::operator<<(aoStack_930,(string *)&Logger.Prefix);
            local_730 = &Logger;
            local_738 = local_780;
            local_740 = local_790;
            local_748 = local_798;
            local_6f0 = &Logger;
            local_6f8 = local_780;
            local_700 = local_790;
            local_6e0 = local_780;
            local_6e8 = local_790;
            std::operator<<((ostream *)(local_780 + 0x10),local_790);
            local_718 = &Logger;
            local_720 = local_738;
            local_728 = local_748;
            local_708 = local_738;
            local_710 = local_748;
            std::operator<<((ostream *)(local_738 + 0x10),local_748);
            logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write
                      ((OutputWorker *)in_stack_ffffffffffffea50,in_stack_ffffffffffffea48);
            logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10e4cf);
          }
          std::__cxx11::string::~string(local_1478);
        }
        local_1420 = 0;
      }
      else {
        local_1420 = 2;
      }
      std::__cxx11::string::~string(local_1418);
    } while (local_1420 == 0);
    local_1090 = &Logger;
    local_1098 = "...ENTER press detected.  Stopping..";
    local_6c8 = &Logger;
    local_6cc = 1;
    local_6d8 = "...ENTER press detected.  Stopping..";
    local_6b8 = &Logger;
    local_6bc = 1;
    if ((int)Logger.ChannelMinLevel < 2) {
      local_508 = &Logger;
      local_50c = 1;
      local_518 = "...ENTER press detected.  Stopping..";
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffea10,
                 (char *)CONCAT44(in_stack_ffffffffffffea0c,in_stack_ffffffffffffea08),Trace);
      local_4f8 = 0x12d358;
      local_4e8 = &Logger;
      local_4f0 = local_6a0;
      local_500 = local_518;
      local_4d0 = &Logger;
      local_4e0 = local_4f8;
      local_4d8 = local_4f0;
      local_4c8 = local_4f8;
      local_4c0 = local_4f0;
      std::operator<<(aoStack_690,(string *)&Logger.Prefix);
      local_4a8 = &Logger;
      local_4b0 = local_4f0;
      local_4b8 = local_500;
      local_498 = local_4f0;
      local_4a0 = local_500;
      std::operator<<((ostream *)(local_4f0 + 0x10),local_500);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)in_stack_ffffffffffffea50,in_stack_ffffffffffffea48);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10e7d9);
    }
  }
  MyClient::~MyClient((MyClient *)in_stack_ffffffffffffea10);
  local_1080 = &Logger;
  local_1088 = "Test complete.  *** Timing results:";
  local_1048 = &Logger;
  local_104c = 2;
  local_1058 = "Test complete.  *** Timing results:";
  local_1038 = &Logger;
  local_103c = 2;
  if ((int)Logger.ChannelMinLevel < 3) {
    local_e88 = &Logger;
    local_e8c = 2;
    local_e98 = "Test complete.  *** Timing results:";
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffea10,
               (char *)CONCAT44(in_stack_ffffffffffffea0c,in_stack_ffffffffffffea08),Trace);
    local_e78 = 0x12d358;
    local_e68 = &Logger;
    local_e80 = local_e98;
    local_e50 = &Logger;
    local_e70 = local_1020;
    local_e60 = local_e78;
    local_e58 = local_1020;
    local_e48 = local_e78;
    local_e40 = local_1020;
    std::operator<<(aoStack_1010,(string *)&Logger.Prefix);
    local_e28 = &Logger;
    local_e30 = local_e70;
    local_e38 = local_e80;
    local_e18 = local_e70;
    local_e20 = local_e80;
    std::operator<<((ostream *)(local_e70 + 0x10),local_e80);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write((OutputWorker *)in_stack_ffffffffffffea50,in_stack_ffffffffffffea48)
    ;
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10ea43);
  }
  test::FunctionTimer::Print(in_stack_ffffffffffffeaf0,in_stack_ffffffffffffeaec);
  test::FunctionTimer::Print(in_stack_ffffffffffffeaf0,in_stack_ffffffffffffeaec);
  test::FunctionTimer::Print(in_stack_ffffffffffffeaf0,in_stack_ffffffffffffeaec);
  test::FunctionTimer::Print(in_stack_ffffffffffffeaf0,in_stack_ffffffffffffeaec);
  test::FunctionTimer::Print(in_stack_ffffffffffffeaf0,in_stack_ffffffffffffeaec);
  local_1070 = &Logger;
  local_1078 = "Press ENTER key to terminate";
  local_480 = &Logger;
  local_484 = 1;
  local_490 = "Press ENTER key to terminate";
  local_470 = &Logger;
  local_474 = 1;
  if ((int)Logger.ChannelMinLevel < 2) {
    local_2c0 = &Logger;
    local_2c4 = 1;
    local_2d0 = "Press ENTER key to terminate";
    in_stack_ffffffffffffea48 = &local_458;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffea10,
               (char *)CONCAT44(in_stack_ffffffffffffea0c,in_stack_ffffffffffffea08),Trace);
    local_2b0 = 0x12d358;
    local_2a0 = &Logger;
    local_2b8 = local_2d0;
    in_stack_ffffffffffffea50 = &Logger;
    local_288 = &Logger;
    local_2a8 = in_stack_ffffffffffffea48;
    local_298 = local_2b0;
    local_290 = in_stack_ffffffffffffea48;
    local_280 = local_2b0;
    local_278 = in_stack_ffffffffffffea48;
    std::operator<<((ostream *)&in_stack_ffffffffffffea48->LogStream,(string *)&Logger.Prefix);
    local_268 = local_2a8;
    local_270 = local_2b8;
    local_250 = local_2a8;
    local_258 = local_2b8;
    local_260 = (OutputWorker *)in_stack_ffffffffffffea50;
    std::operator<<((ostream *)&local_2a8->LogStream,local_2b8);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write((OutputWorker *)in_stack_ffffffffffffea50,in_stack_ffffffffffffea48)
    ;
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10ece3);
  }
  getchar();
  local_1060 = &Logger;
  local_1068 = "...Key press detected.  Terminating..";
  local_238 = &Logger;
  local_23c = 1;
  local_248 = "...Key press detected.  Terminating..";
  local_228 = &Logger;
  local_22c = 1;
  if ((int)Logger.ChannelMinLevel < 2) {
    local_78 = &Logger;
    local_7c = 1;
    local_88 = "...Key press detected.  Terminating..";
    pCVar5 = &Logger;
    in_stack_ffffffffffffea20 = &local_210;
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffea10,
               (char *)CONCAT44(in_stack_ffffffffffffea0c,in_stack_ffffffffffffea08),Trace);
    local_68 = &pCVar5->Prefix;
    local_70 = local_88;
    local_60 = in_stack_ffffffffffffea20;
    local_58 = pCVar5;
    local_50 = local_68;
    local_48 = in_stack_ffffffffffffea20;
    local_40 = pCVar5;
    local_38 = local_68;
    local_30 = in_stack_ffffffffffffea20;
    std::operator<<((ostream *)
                    ((in_stack_ffffffffffffea20->StartStopLock).super___mutex_base._M_mutex.__size +
                    0x10),(string *)local_68);
    local_20 = local_60;
    local_28 = local_70;
    local_8 = local_60;
    local_10 = local_70;
    local_18 = pCVar5;
    std::operator<<((ostream *)((local_60->StartStopLock).super___mutex_base._M_mutex.__size + 0x10)
                    ,local_70);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write((OutputWorker *)in_stack_ffffffffffffea50,in_stack_ffffffffffffea48)
    ;
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10ef30);
  }
  logger::OutputWorker::GetInstance();
  logger::OutputWorker::Flush(in_stack_ffffffffffffea20);
  return 0;
}

Assistant:

int main()
{
    {
        MyClient client;
        if (client.Initialize())
        {
            Logger.Debug("Press SPACE key to stop server. Any other key will send an advertisement broadcast");

            for (;;)
            {
                char cline[512];
                if (!std::cin.getline(cline, sizeof(cline))) {
                    break;
                }
                std::string line = cline;
                if (line.empty()) {
                    break;
                }

                // Send ping
                uint8_t ping[kPongBytes] = {
                    ID_Advertise_Ping, 1, 2, 3, 4
                };
                tonk::SDKResult result = client.Advertise(TONK_BROADCAST, kUDPServerPort_Server, ping, kPongBytes);
                if (result) {
                    Logger.Info("Sent advertisement");
                }
                else
                {
                    TONK_CPP_SDK_DEBUG_BREAK();
                    Logger.Error("Advertise failed: ", result.ToString());
                }
            }

            Logger.Debug("...ENTER press detected.  Stopping..");
        }
    }

    Logger.Info("Test complete.  *** Timing results:");

    t_tonk_connect.Print();
    t_tonk_socket_destroy.Print();
    t_tonk_send.Print();
    t_tonk_flush.Print();
    t_tonk_free.Print();

    Logger.Debug("Press ENTER key to terminate");
    ::getchar();
    Logger.Debug("...Key press detected.  Terminating..");

    logger::Flush();

    return 0;
}